

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BatchnormLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_batchnorm(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  BatchnormLayerParams *pBVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_batchnorm(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_batchnorm(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pBVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::BatchnormLayerParams>(arena);
    (this->layer_).batchnorm_ = pBVar2;
  }
  return (BatchnormLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BatchnormLayerParams* NeuralNetworkLayer::_internal_mutable_batchnorm() {
  if (!_internal_has_batchnorm()) {
    clear_layer();
    set_has_batchnorm();
    layer_.batchnorm_ = CreateMaybeMessage< ::CoreML::Specification::BatchnormLayerParams >(GetArenaForAllocation());
  }
  return layer_.batchnorm_;
}